

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

LY_ERR ly_ctx_new_ylmem(char *search_dir,char *data,LYD_FORMAT format,int options,ly_ctx **ctx)

{
  lyd_node *local_48;
  lyd_node *data_yl;
  ly_ctx *ctx_yl;
  ly_ctx **pplStack_30;
  LY_ERR ret;
  ly_ctx **ctx_local;
  int options_local;
  LYD_FORMAT format_local;
  char *data_local;
  char *search_dir_local;
  
  ctx_yl._4_4_ = 0;
  data_yl = (lyd_node *)0x0;
  local_48 = (lyd_node *)0x0;
  pplStack_30 = ctx;
  ctx_local._0_4_ = options;
  ctx_local._4_4_ = format;
  _options_local = data;
  data_local = search_dir;
  if (data == (char *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","data","ly_ctx_new_ylmem")
    ;
    search_dir_local._4_4_ = LY_EINVAL;
  }
  else if (ctx == (ly_ctx **)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","ctx","ly_ctx_new_ylmem");
    search_dir_local._4_4_ = LY_EINVAL;
  }
  else {
    ctx_yl._4_4_ = ly_ctx_new(search_dir,0,(ly_ctx **)&data_yl);
    if ((ctx_yl._4_4_ == LY_SUCCESS) &&
       (ctx_yl._4_4_ = lyd_parse_data_mem((ly_ctx *)data_yl,_options_local,ctx_local._4_4_,0,2,
                                          &local_48), ctx_yl._4_4_ == LY_SUCCESS)) {
      ctx_yl._4_4_ = ly_ctx_new_yldata(data_local,local_48,(int)ctx_local,pplStack_30);
    }
    lyd_free_all(local_48);
    ly_ctx_destroy((ly_ctx *)data_yl);
    search_dir_local._4_4_ = ctx_yl._4_4_;
  }
  return search_dir_local._4_4_;
}

Assistant:

LIBYANG_API_DEF LY_ERR
ly_ctx_new_ylmem(const char *search_dir, const char *data, LYD_FORMAT format, int options, struct ly_ctx **ctx)
{
    LY_ERR ret = LY_SUCCESS;
    struct ly_ctx *ctx_yl = NULL;
    struct lyd_node *data_yl = NULL;

    LY_CHECK_ARG_RET(NULL, data, ctx, LY_EINVAL);

    /* create a seperate context for the data */
    LY_CHECK_GOTO(ret = ly_ctx_new(search_dir, 0, &ctx_yl), cleanup);

    /* parse yang library data tree */
    LY_CHECK_GOTO(ret = lyd_parse_data_mem(ctx_yl, data, format, 0, LYD_VALIDATE_PRESENT, &data_yl), cleanup);

    /* create the new context */
    ret = ly_ctx_new_yldata(search_dir, data_yl, options, ctx);

cleanup:
    lyd_free_all(data_yl);
    ly_ctx_destroy(ctx_yl);
    return ret;
}